

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int get_symbol_value(ListNode *head,char **symbol_names,size_t number_of_symbol_names,void **output)

{
  long lVar1;
  int iVar2;
  ListNode *head_00;
  unsigned_long *in_RCX;
  char **in_RDX;
  ListNode *in_RSI;
  long in_FS_OFFSET;
  int return_value;
  ListNode *child_list;
  SymbolMapValue *map_value;
  char *symbol_name;
  ListNode *value_node;
  ListNode *target_node;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar3;
  EqualityFunction in_stack_ffffffffffffffa8;
  char *expression;
  void *in_stack_ffffffffffffffb0;
  unsigned_long uVar4;
  ListNode *head_01;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _assert_true((unsigned_long)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  _assert_true((unsigned_long)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  _assert_true((unsigned_long)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  _assert_true((unsigned_long)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
               (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  head_01 = (ListNode *)in_RSI->value;
  iVar2 = list_find(head_01,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                    (ListNode **)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (iVar2 == 0) {
LAB_0016e031:
    cm_print_error("No entries for symbol %s.\n",head_01);
    local_1c = 0;
  }
  else {
    uVar4 = 0;
    expression = (char *)0x0;
    uVar3 = 0;
    _assert_true(0,(char *)0x0,(char *)(ulong)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    _assert_true(uVar4,expression,(char *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    head_00 = (ListNode *)(uRam0000000000000000 + 8);
    if (in_RDX == (char **)0x1) {
      uVar4 = uRam0000000000000000;
      iVar2 = list_first(head_00,(ListNode **)CONCAT44(uVar3,in_stack_ffffffffffffffa0));
      _assert_true(uVar4,(char *)head_00,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c);
      if (iVar2 == 0) goto LAB_0016e031;
      *in_RCX = uRam0000000000000000;
      local_1c = iRam0000000000000008;
      if (iRam0000000000000008 == 1) {
        list_remove_free((ListNode *)CONCAT44(1,in_stack_ffffffffffffffa0),
                         (CleanupListValue)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (void *)0x16dfbd);
      }
      else if (-2 < iRam0000000000000008) {
        iRam0000000000000008 = iRam0000000000000008 + -1;
      }
    }
    else {
      local_1c = get_symbol_value(in_RSI,in_RDX,(size_t)in_RCX,&head_01->value);
    }
    iVar2 = list_empty((ListNode *)0x16e00b);
    if (iVar2 != 0) {
      list_remove_free((ListNode *)CONCAT44(local_1c,in_stack_ffffffffffffffa0),
                       (CleanupListValue)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (void *)0x16e025);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

static int get_symbol_value(
        ListNode * const head, const char * const symbol_names[],
        const size_t number_of_symbol_names, void **output) {
    const char* symbol_name = NULL;
    ListNode *target_node = NULL;
    assert_non_null(head);
    assert_non_null(symbol_names);
    assert_true(number_of_symbol_names);
    assert_non_null(output);
    symbol_name = symbol_names[0];

    if (list_find(head, symbol_name, symbol_names_match, &target_node)) {
        SymbolMapValue *map_value = NULL;
        ListNode *child_list = NULL;
        int return_value = 0;
        assert_non_null(target_node);
        assert_non_null(target_node->value);

        map_value = (SymbolMapValue*)target_node->value;
        child_list = &map_value->symbol_values_list_head;

        if (number_of_symbol_names == 1) {
            ListNode *value_node = NULL;
            return_value = list_first(child_list, &value_node);
            assert_true(return_value);
            /* Add a check to silence clang analyzer */
            if (return_value == 0) {
                goto out;
            }
            *output = (void*) value_node->value;
            return_value = value_node->refcount;
            if (value_node->refcount - 1 == 0) {
                list_remove_free(value_node, NULL, NULL);
            } else if (value_node->refcount > WILL_RETURN_ONCE) {
                --value_node->refcount;
            }
        } else {
            return_value = get_symbol_value(
                child_list, &symbol_names[1], number_of_symbol_names - 1,
                output);
        }
        if (list_empty(child_list)) {
            list_remove_free(target_node, free_symbol_map_value, (void*)0);
        }
        return return_value;
    }
out:
    cm_print_error("No entries for symbol %s.\n", symbol_name);
    return 0;
}